

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-knowledge.c
# Opt level: O0

wchar_t feat_order(wchar_t feat)

{
  feature *f;
  wchar_t feat_local;
  
  switch(f_info[feat].d_char) {
  case L' ':
    f._4_4_ = L'\a';
    break;
  default:
    f._4_4_ = L'\x06';
    break;
  case L'#':
    f._4_4_ = L'\x03';
    break;
  case L'%':
  case L'*':
    f._4_4_ = L'\x04';
    break;
  case L'\'':
  case L'+':
    f._4_4_ = L'\x01';
    break;
  case L'.':
    f._4_4_ = L'\0';
    break;
  case L':':
  case L';':
    f._4_4_ = L'\x05';
    break;
  case L'<':
  case L'>':
    f._4_4_ = L'\x02';
  }
  return f._4_4_;
}

Assistant:

static int feat_order(int feat)
{
	struct feature *f = &f_info[feat];

	switch (f->d_char)
	{
		case L'.': 				return 0;
		case L'\'': case L'+': 	return 1;
		case L'<': case L'>':	return 2;
		case L'#':				return 3;
		case L'*': case L'%' :	return 4;
		case L';': case L':' :	return 5;
		case L' ':				return 7;
		default:
		{
			return 6;
		}
	}
}